

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTransaction::ConfidentialTransaction
          (ConfidentialTransaction *this,int32_t version,uint32_t lock_time)

{
  CfdException *this_00;
  int ret;
  wally_tx *tx_pointer;
  int local_54;
  wally_tx *local_50;
  undefined1 local_48 [32];
  
  AbstractTransaction::AbstractTransaction(&this->super_AbstractTransaction);
  (this->super_AbstractTransaction)._vptr_AbstractTransaction =
       (_func_int **)&PTR__ConfidentialTransaction_00691950;
  (this->vin_).
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vin_).
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vin_).
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vout_).
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vout_).
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vout_).
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = (wally_tx *)0x0;
  local_54 = wally_tx_init_alloc(version,lock_time,0,0,&local_50);
  if (local_54 == 0) {
    (this->super_AbstractTransaction).wally_tx_pointer_ = local_50;
    return;
  }
  local_48._0_8_ = "cfdcore_elements_transaction.cpp";
  local_48._8_4_ = 0x4f6;
  local_48._16_8_ = "ConfidentialTransaction";
  logger::log<int&>((CfdSourceLocation *)local_48,kCfdLogLevelWarning,"wally_tx_init_alloc NG[{}] ",
                    &local_54);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_48._0_8_ = local_48 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"transaction data generate error.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_48);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ConfidentialTransaction::ConfidentialTransaction(
    int32_t version, uint32_t lock_time)
    : vin_(), vout_() {
  struct wally_tx *tx_pointer = NULL;
  int ret = wally_tx_init_alloc(version, lock_time, 0, 0, &tx_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_init_alloc NG[{}] ", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "transaction data generate error.");
  }
  wally_tx_pointer_ = tx_pointer;
}